

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O3

void __thiscall btDbvtTreeCollider::Process(btDbvtTreeCollider *this,btDbvtNode *na,btDbvtNode *nb)

{
  int *piVar1;
  btOverlappingPairCache *pbVar2;
  
  if (na != nb) {
    pbVar2 = this->pbp->m_paircache;
    (*(pbVar2->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
              (pbVar2,(na->field_2).childs[0],(nb->field_2).childs[0]);
    piVar1 = &this->pbp->m_newpairs;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

void	Process(const btDbvtNode* na,const btDbvtNode* nb)
	{
		if(na!=nb)
		{
			btDbvtProxy*	pa=(btDbvtProxy*)na->data;
			btDbvtProxy*	pb=(btDbvtProxy*)nb->data;
#if DBVT_BP_SORTPAIRS
			if(pa->m_uniqueId>pb->m_uniqueId) 
				btSwap(pa,pb);
#endif
			pbp->m_paircache->addOverlappingPair(pa,pb);
			++pbp->m_newpairs;
		}
	}